

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult gt_cntfrq_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 != 0) {
      uVar3 = env->pstate >> 2 & 3;
      goto LAB_0061c6e3;
    }
    uVar3 = env->uncached_cpsr & 0x1f;
    if (uVar3 == 0x10) {
LAB_0061c712:
      uVar2 = arm_hcr_el2_eff_aarch64(env);
      if ((~uVar2 & 0x408000000) == 0) {
        uVar4 = (env->cp15).cnthctl_el2;
      }
      else {
        uVar4 = (uint)(env->cp15).c14_cntkctl;
      }
      uVar3 = 0;
      if ((uVar4 & 3) == 0) {
        return CP_ACCESS_TRAP;
      }
      goto LAB_0061c751;
    }
    if (uVar3 == 0x1a) {
      uVar3 = 2;
      goto LAB_0061c751;
    }
    if (uVar3 == 0x16) {
LAB_0061c70b:
      uVar3 = 3;
      goto LAB_0061c751;
    }
    if ((uVar1 >> 0x21 & 1) != 0) {
      if (uVar3 == 0x16) {
        uVar3 = 3;
        if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061c751;
      }
      else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0061c70b;
    }
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_0061c79e;
    uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
LAB_0061c6e3:
    if (uVar3 != 1) {
      if (uVar3 == 0) goto LAB_0061c712;
LAB_0061c751:
      if (isread) {
        return CP_ACCESS_OK;
      }
      goto LAB_0061c7c1;
    }
  }
LAB_0061c79e:
  if (isread) {
    return CP_ACCESS_OK;
  }
  uVar3 = 1;
  if (((uVar1 & 0x200000000) != 0) && (ri->state == 0)) {
    return CP_ACCESS_TRAP_UNCATEGORIZED;
  }
LAB_0061c7c1:
  uVar4 = 3;
  if ((uVar1 & 0x200000000) == 0) {
    uVar4 = ((uVar1 >> 0x20 & 1) != 0) + 1;
  }
  if (uVar4 <= uVar3) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_UNCATEGORIZED;
}

Assistant:

static CPAccessResult gt_cntfrq_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                       bool isread)
{
    /* CNTFRQ: not visible from PL0 if both PL0PCTEN and PL0VCTEN are zero.
     * Writable only at the highest implemented exception level.
     */
    int el = arm_current_el(env);
    uint64_t hcr;
    uint32_t cntkctl;

    switch (el) {
    case 0:
        hcr = arm_hcr_el2_eff(env);
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            cntkctl = env->cp15.cnthctl_el2;
        } else {
            cntkctl = env->cp15.c14_cntkctl;
        }
        if (!extract32(cntkctl, 0, 2)) {
            return CP_ACCESS_TRAP;
        }
        break;
    case 1:
        if (!isread && ri->state == ARM_CP_STATE_AA32 &&
            arm_is_secure_below_el3(env)) {
            /* Accesses from 32-bit Secure EL1 UNDEF (*not* trap to EL3!) */
            return CP_ACCESS_TRAP_UNCATEGORIZED;
        }
        break;
    case 2:
    case 3:
        break;
    }

    if (!isread && el < arm_highest_el(env)) {
        return CP_ACCESS_TRAP_UNCATEGORIZED;
    }

    return CP_ACCESS_OK;
}